

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep_io.c
# Opt level: O0

int sprkStep_PrintAllStats(ARKodeMem ark_mem,FILE *outfile,SUNOutputFormat fmt)

{
  undefined4 in_EDX;
  int retval;
  ARKodeSPRKStepMem step_mem;
  ARKodeSPRKStepMem *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  undefined8 uVar1;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  uVar1 = 0;
  local_4 = sprkStep_AccessStepMem
                      ((ARKodeMem)0x0,(char *)(ulong)in_stack_ffffffffffffffd0,
                       in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)uVar1 >> 0x20),(int)uVar1,
                    (char *)(ulong)in_stack_ffffffffffffffd0,(long)in_stack_ffffffffffffffc8);
    sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)uVar1 >> 0x20),(int)uVar1,
                    (char *)CONCAT44(local_4,in_stack_ffffffffffffffd0),
                    (long)in_stack_ffffffffffffffc8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int sprkStep_PrintAllStats(ARKodeMem ark_mem, FILE* outfile, SUNOutputFormat fmt)
{
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  sunfprintf_long(outfile, fmt, SUNFALSE, "f1 RHS fn evals", step_mem->nf1);
  sunfprintf_long(outfile, fmt, SUNFALSE, "f2 RHS fn evals", step_mem->nf2);

  return (ARK_SUCCESS);
}